

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O1

void Ssw_ManFindStartingState(Ssw_Man_t *p,Abc_Cex_t *pCex)

{
  ulong *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Aig_Man_t *pAVar7;
  uint uVar8;
  long lVar9;
  Vec_Ptr_t *pVVar10;
  uint uVar11;
  uint uVar12;
  
  pAVar7 = p->pAig;
  if (0 < pAVar7->nRegs) {
    iVar5 = 0;
    do {
      uVar8 = pAVar7->nTruePos + iVar5;
      if (((int)uVar8 < 0) || (pAVar7->vCos->nSize <= (int)uVar8)) goto LAB_006a44bf;
      puVar1 = (ulong *)((long)pAVar7->vCos->pArray[uVar8] + 0x18);
      *puVar1 = *puVar1 & 0xffffffffffffffdf;
      iVar5 = iVar5 + 1;
      pAVar7 = p->pAig;
    } while (iVar5 < pAVar7->nRegs);
  }
  uVar8 = pCex->nRegs;
  if (-1 < pCex->iFrame) {
    iVar5 = 0;
    do {
      puVar2 = &p->pAig->pConst1->field_0x18;
      *(ulong *)puVar2 = *(ulong *)puVar2 | 0x20;
      pAVar7 = p->pAig;
      if (0 < pAVar7->nTruePis) {
        lVar9 = 0;
        do {
          if (pAVar7->vCis->nSize <= lVar9) goto LAB_006a44bf;
          pvVar3 = pAVar7->vCis->pArray[lVar9];
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)uVar8 + lVar9) >> 5] >>
                        ((byte)((ulong)uVar8 + lVar9) & 0x1f) & 1) << 5);
          lVar9 = lVar9 + 1;
          pAVar7 = p->pAig;
        } while (lVar9 < pAVar7->nTruePis);
        uVar8 = uVar8 + (int)lVar9;
      }
      pAVar7 = p->pAig;
      if (0 < pAVar7->nRegs) {
        iVar6 = 0;
        do {
          uVar11 = pAVar7->nTruePos + iVar6;
          if (((((int)uVar11 < 0) || (pAVar7->vCos->nSize <= (int)uVar11)) ||
              (uVar12 = pAVar7->nTruePis + iVar6, (int)uVar12 < 0)) ||
             (pAVar7->vCis->nSize <= (int)uVar12)) goto LAB_006a44bf;
          pvVar3 = pAVar7->vCis->pArray[uVar12];
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)((uint)*(undefined8 *)((long)pAVar7->vCos->pArray[uVar11] + 0x18) & 0x20);
          iVar6 = iVar6 + 1;
          pAVar7 = p->pAig;
        } while (iVar6 < pAVar7->nRegs);
      }
      pVVar10 = p->pAig->vObjs;
      if (0 < pVVar10->nSize) {
        lVar9 = 0;
        do {
          pvVar3 = pVVar10->pArray[lVar9];
          if ((pvVar3 != (void *)0x0) &&
             (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7)) {
            *(ulong *)((long)pvVar3 + 0x18) =
                 *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
                 (ulong)((((uint)*(ulong *)((long)pvVar3 + 0x10) ^
                          *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x18)
                          >> 5) & ((uint)*(ulong *)((long)pvVar3 + 8) ^
                                  *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) +
                                           0x18) >> 5) & 1) << 5);
          }
          lVar9 = lVar9 + 1;
          pVVar10 = p->pAig->vObjs;
        } while (lVar9 < pVVar10->nSize);
      }
      pVVar10 = p->pAig->vCos;
      if (0 < pVVar10->nSize) {
        lVar9 = 0;
        do {
          pvVar3 = pVVar10->pArray[lVar9];
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((int)*(ulong *)((long)pvVar3 + 8) << 5 ^
                       *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20
                      );
          lVar9 = lVar9 + 1;
          pVVar10 = p->pAig->vCos;
        } while (lVar9 < pVVar10->nSize);
      }
      bVar4 = iVar5 < pCex->iFrame;
      iVar5 = iVar5 + 1;
    } while (bVar4);
  }
  if (uVar8 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswFilter.c"
                  ,0xa3,"void Ssw_ManFindStartingState(Ssw_Man_t *, Abc_Cex_t *)");
  }
  pAVar7 = p->pAig;
  if (0 < pAVar7->nRegs) {
    pVVar10 = pAVar7->vCis;
    iVar5 = 0;
    do {
      uVar8 = pAVar7->nTruePis + iVar5;
      if (((int)uVar8 < 0) || (pVVar10->nSize <= (int)uVar8)) {
LAB_006a44bf:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar11 = p->pPatWords[uVar8 >> 5];
      if (((uVar11 >> (sbyte)(uVar8 & 0x1f) ^ *(uint *)((long)pVVar10->pArray[uVar8] + 0x18) >> 5) &
          1) != 0) {
        p->pPatWords[uVar8 >> 5] = uVar11 ^ 1 << (uVar8 & 0x1f);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < pAVar7->nRegs);
  }
  return;
}

Assistant:

void Ssw_ManFindStartingState( Ssw_Man_t * p, Abc_Cex_t * pCex )
{
    Aig_Obj_t * pObj, * pObjLi;
    int f, i, iBit;
    // assign register outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        pObj->fMarkB = 0;
    // simulate the timeframes
    iBit = pCex->nRegs;
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        // set the PI simulation information
        Aig_ManConst1(p->pAig)->fMarkB = 1;
        Saig_ManForEachPi( p->pAig, pObj, i )
            pObj->fMarkB = Abc_InfoHasBit( pCex->pData, iBit++ );
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
            pObj->fMarkB = pObjLi->fMarkB;
        // simulate internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                         & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
        // assign the COs
        Aig_ManForEachCo( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) );
    }
    assert( iBit == pCex->nBits );
    // check that the output failed as expected -- cannot check because it is not an SRM!
//    pObj = Aig_ManCo( p->pAig, pCex->iPo );
//    if ( pObj->fMarkB != 1 )
//        Abc_Print( 1, "The counter-example does not refine the output.\n" );
    // record the new pattern
    Saig_ManForEachLo( p->pAig, pObj, i )
        if ( pObj->fMarkB ^ Abc_InfoHasBit(p->pPatWords, Saig_ManPiNum(p->pAig) + i) )
            Abc_InfoXorBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i );
}